

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

undefined8 tonk::GetConnectionLogPrefix(string *hostname,uint16_t port)

{
  ostream *poVar1;
  ushort in_DX;
  string *in_RSI;
  undefined8 in_RDI;
  ostringstream oss;
  ostringstream local_190 [382];
  ushort local_12;
  string *local_10;
  
  local_12 = in_DX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"[");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_12);
  std::operator<<(poVar1,"] ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

static std::string GetConnectionLogPrefix(const std::string& hostname, uint16_t port)
{
    std::ostringstream oss;
    oss << "[" << hostname << ":" << port << "] ";
    return oss.str();
}